

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O0

Status * __thiscall
draco::Decoder::DecodeBufferToGeometry
          (Decoder *this,DecoderBuffer *in_buffer,PointCloud *out_geometry)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Status *in_RDI;
  PointCloud *in_stack_00000030;
  DecoderBuffer *in_stack_00000038;
  DecoderOptions *in_stack_00000040;
  PointCloudDecoder *in_stack_00000048;
  DracoHeader *in_stack_00000050;
  unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_> decoder;
  StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
  _statusor115;
  DracoHeader header;
  DecoderBuffer temp_buffer;
  Status *_local_status;
  undefined4 in_stack_fffffffffffffec8;
  undefined2 in_stack_fffffffffffffecc;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
  *in_stack_fffffffffffffed0;
  Status *__s;
  undefined6 in_stack_ffffffffffffff18;
  byte bVar2;
  byte bVar3;
  undefined1 local_e0 [71];
  allocator<char> local_99;
  string local_98 [23];
  int8_t in_stack_ffffffffffffff7f;
  char local_5d;
  
  __s = in_RDI;
  PointCloudDecoder::DecodeHeader
            ((DecoderBuffer *)
             decoder._M_t.
             super___uniq_ptr_impl<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::PointCloudDecoder_*,_std::default_delete<draco::PointCloudDecoder>_>
             .super__Head_base<0UL,_draco::PointCloudDecoder_*,_false>._M_head_impl,
             in_stack_00000050);
  bVar1 = Status::ok(in_RDI);
  if (bVar1) {
    Status::~Status((Status *)0x153791);
    if (local_5d == '\0') {
      CreatePointCloudDecoder(in_stack_ffffffffffffff7f);
      bVar1 = StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
              ::ok((StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
                    *)0x15388a);
      if (bVar1) {
        StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
        ::value((StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
                 *)(local_e0 + 0x10));
        in_stack_fffffffffffffed0 =
             (StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
              *)local_e0;
        std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>::
        unique_ptr((unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
                    *)in_stack_fffffffffffffed0,
                   (unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
                    *)CONCAT17(in_stack_fffffffffffffecf,
                               CONCAT16(in_stack_fffffffffffffece,
                                        CONCAT24(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8
                                                ))));
        bVar3 = 0;
        std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>::
        operator->((unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
                    *)0x153936);
        PointCloudDecoder::DecodeStep1
                  (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030);
        bVar1 = Status::ok(in_RDI);
        if (!bVar1) {
          bVar3 = 1;
        }
        if ((bVar3 & 1) == 0) {
          Status::~Status((Status *)0x1539de);
        }
        if (bVar1) {
          bVar2 = 0;
          std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
          ::operator->((unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
                        *)0x1539fe);
          PointCloudDecoder::DecodeStep2
                    ((PointCloudDecoder *)CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffff18)))
          ;
          bVar1 = Status::ok(in_RDI);
          if (!bVar1) {
            bVar2 = 1;
          }
          if ((bVar2 & 1) == 0) {
            Status::~Status((Status *)0x153a75);
          }
          if (bVar1) {
            OkStatus();
          }
        }
        std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>::
        ~unique_ptr((unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
                     *)in_stack_fffffffffffffed0);
      }
      else {
        local_e0[0xf] = 0;
        StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
        ::status((StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
                  *)(local_e0 + 0x10));
        Status::Status(&in_stack_fffffffffffffed0->status_,
                       (Status *)
                       CONCAT17(in_stack_fffffffffffffecf,
                                CONCAT16(in_stack_fffffffffffffece,
                                         CONCAT24(in_stack_fffffffffffffecc,
                                                  in_stack_fffffffffffffec8))));
        local_e0[0xf] = 1;
      }
      StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
      ::~StatusOr(in_stack_fffffffffffffed0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RSI,(char *)__s,(allocator<char> *)in_RDI);
      Status::Status(&in_stack_fffffffffffffed0->status_,
                     CONCAT13(in_stack_fffffffffffffecf,
                              CONCAT12(in_stack_fffffffffffffece,in_stack_fffffffffffffecc)),
                     (string *)0x1537f7);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator(&local_99);
    }
  }
  DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x153ad6);
  return __s;
}

Assistant:

Status Decoder::DecodeBufferToGeometry(DecoderBuffer *in_buffer,
                                       PointCloud *out_geometry) {
#ifdef DRACO_POINT_CLOUD_COMPRESSION_SUPPORTED
  DecoderBuffer temp_buffer(*in_buffer);
  DracoHeader header;
  DRACO_RETURN_IF_ERROR(PointCloudDecoder::DecodeHeader(&temp_buffer, &header))
  if (header.encoder_type != POINT_CLOUD) {
    return Status(Status::DRACO_ERROR, "Input is not a point cloud.");
  }
  DRACO_ASSIGN_OR_RETURN(std::unique_ptr<PointCloudDecoder> decoder,
                         CreatePointCloudDecoder(header.encoder_method))

  DRACO_RETURN_IF_ERROR(decoder->DecodeStep1(options_, in_buffer, out_geometry))
  DRACO_RETURN_IF_ERROR(decoder->DecodeStep2())
  return OkStatus();
#else
  return Status(Status::DRACO_ERROR, "Unsupported geometry type.");
#endif
}